

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O2

void __thiscall
ON_3dmAnnotationSettings::Internal_CopyFrom
          (ON_3dmAnnotationSettings *this,ON_3dmAnnotationSettings *src)

{
  ON_3dmAnnotationSettingsPrivate *pOVar1;
  double dVar2;
  undefined8 uVar3;
  uchar uVar4;
  uchar uVar5;
  uchar uVar6;
  ON__UINT8 OVar7;
  ON__UINT8 OVar8;
  LengthUnitSystem LVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  float fVar13;
  bool bVar14;
  undefined3 uVar15;
  uint uVar16;
  uint uVar17;
  unsigned_short uVar18;
  unsigned_short uVar19;
  ON_3dmAnnotationSettingsPrivate *pOVar20;
  
  dVar2 = src->m_textheight;
  this->m_dimscale = src->m_dimscale;
  this->m_textheight = dVar2;
  dVar2 = src->m_dimexo;
  this->m_dimexe = src->m_dimexe;
  this->m_dimexo = dVar2;
  dVar2 = src->m_arrowwidth;
  this->m_arrowlength = src->m_arrowlength;
  this->m_arrowwidth = dVar2;
  this->m_centermark = src->m_centermark;
  uVar4 = src->m_bEnableModelSpaceAnnotationScaling;
  uVar5 = src->m_bEnableLayoutSpaceAnnotationScaling;
  uVar6 = src->m_bEnableHatchScaling;
  this->m_b_V5_EnableAnnotationScaling = src->m_b_V5_EnableAnnotationScaling;
  this->m_bEnableModelSpaceAnnotationScaling = uVar4;
  this->m_bEnableLayoutSpaceAnnotationScaling = uVar5;
  this->m_bEnableHatchScaling = uVar6;
  this->m_reserved1 = src->m_reserved1;
  OVar7 = src->m_reserved3;
  OVar8 = src->m_reserved4;
  LVar9 = src->m_dimunits;
  this->m_reserved2 = src->m_reserved2;
  this->m_reserved3 = OVar7;
  this->m_reserved4 = OVar8;
  this->m_dimunits = LVar9;
  iVar10 = src->m_angularunits;
  iVar11 = src->m_lengthformat;
  iVar12 = src->m_angleformat;
  this->m_arrowtype = src->m_arrowtype;
  this->m_angularunits = iVar10;
  this->m_lengthformat = iVar11;
  this->m_angleformat = iVar12;
  this->m_resolution = src->m_resolution;
  ON_wString::operator=(&this->m_facename,&src->m_facename);
  if (src->m_private != (ON_3dmAnnotationSettingsPrivate *)0x0) {
    pOVar20 = (ON_3dmAnnotationSettingsPrivate *)operator_new(0x1c);
    pOVar20->m_world_view_text_scale = 0.0;
    pOVar20->m_world_view_hatch_scale = 0.0;
    pOVar20->m_use_dimension_layer = false;
    *(undefined3 *)&pOVar20->field_0x9 = 0;
    (pOVar20->m_dimension_layer_id).Data1 = 0;
    pOVar20->m_world_view_text_scale = 1.0;
    pOVar20->m_world_view_hatch_scale = 1.0;
    (pOVar20->m_dimension_layer_id).Data1 = 0;
    (pOVar20->m_dimension_layer_id).Data2 = 0;
    (pOVar20->m_dimension_layer_id).Data3 = 0;
    (pOVar20->m_dimension_layer_id).Data4[0] = '\0';
    (pOVar20->m_dimension_layer_id).Data4[1] = '\0';
    (pOVar20->m_dimension_layer_id).Data4[2] = '\0';
    (pOVar20->m_dimension_layer_id).Data4[3] = '\0';
    (pOVar20->m_dimension_layer_id).Data4[4] = '\0';
    (pOVar20->m_dimension_layer_id).Data4[5] = '\0';
    (pOVar20->m_dimension_layer_id).Data4[6] = '\0';
    (pOVar20->m_dimension_layer_id).Data4[7] = '\0';
    this->m_private = pOVar20;
    pOVar1 = src->m_private;
    fVar13 = pOVar1->m_world_view_hatch_scale;
    bVar14 = pOVar1->m_use_dimension_layer;
    uVar15 = *(undefined3 *)&pOVar1->field_0x9;
    uVar16 = (pOVar1->m_dimension_layer_id).Data1;
    uVar17 = (pOVar1->m_dimension_layer_id).Data1;
    uVar18 = (pOVar1->m_dimension_layer_id).Data2;
    uVar19 = (pOVar1->m_dimension_layer_id).Data3;
    uVar3 = *(undefined8 *)(pOVar1->m_dimension_layer_id).Data4;
    pOVar20->m_world_view_text_scale = pOVar1->m_world_view_text_scale;
    pOVar20->m_world_view_hatch_scale = fVar13;
    pOVar20->m_use_dimension_layer = bVar14;
    *(undefined3 *)&pOVar20->field_0x9 = uVar15;
    (pOVar20->m_dimension_layer_id).Data1 = uVar16;
    (pOVar20->m_dimension_layer_id).Data1 = uVar17;
    (pOVar20->m_dimension_layer_id).Data2 = uVar18;
    (pOVar20->m_dimension_layer_id).Data3 = uVar19;
    *(undefined8 *)(pOVar20->m_dimension_layer_id).Data4 = uVar3;
  }
  return;
}

Assistant:

void ON_3dmAnnotationSettings::Internal_CopyFrom(const ON_3dmAnnotationSettings& src)
{
  m_dimscale = src.m_dimscale;
  m_textheight = src.m_textheight;
  m_dimexe = src.m_dimexe;
  m_dimexo = src.m_dimexo;
  m_arrowlength = src.m_arrowlength;
  m_arrowwidth = src.m_arrowwidth;
  m_centermark = src.m_centermark;
  
  m_b_V5_EnableAnnotationScaling = src.m_b_V5_EnableAnnotationScaling;
  m_bEnableModelSpaceAnnotationScaling = src.m_bEnableModelSpaceAnnotationScaling;
  m_bEnableLayoutSpaceAnnotationScaling = src.m_bEnableLayoutSpaceAnnotationScaling;
  m_bEnableHatchScaling = src.m_bEnableHatchScaling;
  
  m_reserved1 = src.m_reserved1;
  m_reserved2 = src.m_reserved2;
  m_reserved3 = src.m_reserved3;
  m_reserved4 = src.m_reserved4;
  
  m_dimunits = src.m_dimunits;
  m_arrowtype = src.m_arrowtype;
  m_angularunits = src.m_angularunits;
  m_lengthformat = src.m_lengthformat;
  m_angleformat = src.m_angleformat;
  m_resolution = src.m_resolution;
  m_facename = src.m_facename;

  if (src.m_private)
  {
    m_private = new ON_3dmAnnotationSettingsPrivate();
    *m_private = *src.m_private;
  }
}